

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_gtar_gz.c
# Opt level: O0

void test_read_format_gtar_gz(void)

{
  int iVar1;
  archive *a_00;
  void *in_stack_00000010;
  int r;
  archive *a;
  archive_entry *ae;
  archive *in_stack_ffffffffffffffd8;
  archive *a_01;
  void *buff;
  archive_entry **entry;
  int n;
  archive *in_stack_ffffffffffffffe0;
  wchar_t in_stack_ffffffffffffffe8;
  wchar_t in_stack_ffffffffffffffec;
  wchar_t wVar2;
  archive_entry *in_stack_fffffffffffffff8;
  
  a_00 = archive_read_new();
  assertion_assert((char *)a_00,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                   (char *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  archive_read_support_filter_all(in_stack_ffffffffffffffd8);
  a_01 = (archive *)0x0;
  assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)a_00 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)in_stack_ffffffffffffffe0,0,(char *)0x17ad8f,in_stack_00000010);
  iVar1 = archive_read_support_filter_gzip
                    ((archive *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  if (iVar1 == -0x14) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_gz.c"
                   ,L'-');
    wVar2 = (wchar_t)((ulong)a_00 >> 0x20);
    test_skipping("gzip reading not fully supported on this platform");
    archive_read_free((archive *)0x17adcd);
    assertion_equal_int((char *)in_stack_fffffffffffffff8,wVar2,
                        CONCAT44(iVar1,in_stack_ffffffffffffffe8),(char *)in_stack_ffffffffffffffe0,
                        0,(char *)0x17adfb,in_stack_00000010);
  }
  else {
    archive_read_support_format_all(a_01);
    buff = (void *)0x0;
    assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)a_00 >> 0x20),
                        CONCAT44(iVar1,in_stack_ffffffffffffffe8),(char *)in_stack_ffffffffffffffe0,
                        0,(char *)0x17ae38,in_stack_00000010);
    archive_read_open_memory(in_stack_ffffffffffffffe0,buff,0x17ae4e);
    entry = (archive_entry **)0x0;
    assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)a_00 >> 0x20),
                        CONCAT44(iVar1,in_stack_ffffffffffffffe8),(char *)in_stack_ffffffffffffffe0,
                        0,(char *)0x17ae7c,in_stack_00000010);
    archive_read_next_header(in_stack_ffffffffffffffe0,entry);
    assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)a_00 >> 0x20),
                        CONCAT44(iVar1,in_stack_ffffffffffffffe8),(char *)in_stack_ffffffffffffffe0,
                        0,(char *)0x17aeb9,in_stack_00000010);
    archive_file_count(a_00);
    n = 0;
    assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)a_00 >> 0x20),
                        CONCAT44(iVar1,in_stack_ffffffffffffffe8),(char *)in_stack_ffffffffffffffe0,
                        0,(char *)0x17aef4,in_stack_00000010);
    archive_filter_code(in_stack_ffffffffffffffe0,n);
    assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)a_00 >> 0x20),
                        CONCAT44(iVar1,in_stack_ffffffffffffffe8),(char *)in_stack_ffffffffffffffe0,
                        0,(char *)0x17af32,in_stack_00000010);
    archive_format(a_00);
    assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)a_00 >> 0x20),
                        CONCAT44(iVar1,in_stack_ffffffffffffffe8),(char *)in_stack_ffffffffffffffe0,
                        0,(char *)0x17af6e,in_stack_00000010);
    archive_entry_is_encrypted(in_stack_fffffffffffffff8);
    assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)a_00 >> 0x20),
                        CONCAT44(iVar1,in_stack_ffffffffffffffe8),(char *)in_stack_ffffffffffffffe0,
                        0,(char *)0x17afa7,in_stack_00000010);
    archive_read_has_encrypted_entries((archive *)CONCAT44(iVar1,in_stack_ffffffffffffffe8));
    assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)a_00 >> 0x20),
                        CONCAT44(iVar1,in_stack_ffffffffffffffe8),(char *)in_stack_ffffffffffffffe0,
                        (longlong)a_00,(char *)0x17afe3,in_stack_00000010);
    wVar2 = (wchar_t)((ulong)a_00 >> 0x20);
    archive_read_close((archive *)0x17afed);
    assertion_equal_int((char *)in_stack_fffffffffffffff8,wVar2,
                        CONCAT44(iVar1,in_stack_ffffffffffffffe8),(char *)in_stack_ffffffffffffffe0,
                        0,(char *)0x17b01b,in_stack_00000010);
    archive_read_free((archive *)0x17b025);
    assertion_equal_int((char *)in_stack_fffffffffffffff8,wVar2,
                        CONCAT44(iVar1,in_stack_ffffffffffffffe8),(char *)in_stack_ffffffffffffffe0,
                        0,(char *)0x17b053,in_stack_00000010);
  }
  return;
}

Assistant:

DEFINE_TEST(test_read_format_gtar_gz)
{
	struct archive_entry *ae;
	struct archive *a;
	int r;

	assert((a = archive_read_new()) != NULL);
	assertEqualInt(ARCHIVE_OK, archive_read_support_filter_all(a));
	r = archive_read_support_filter_gzip(a);
	if (r == ARCHIVE_WARN) {
		skipping("gzip reading not fully supported on this platform");
		assertEqualInt(ARCHIVE_OK, archive_read_free(a));
		return;
	}
	assertEqualInt(ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualInt(ARCHIVE_OK,
	    archive_read_open_memory(a, archive, sizeof(archive)));
	assertEqualInt(ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(1, archive_file_count(a));
	assertEqualInt(archive_filter_code(a, 0),
	    ARCHIVE_FILTER_GZIP);
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_TAR_GNUTAR);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}